

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

string * __thiscall
Test::Output::stripMethodName(string *__return_storage_ptr__,Output *this,string *methodName)

{
  size_type __pos;
  long lVar1;
  size_type sVar2;
  
  sVar2 = methodName->_M_string_length + 1;
  do {
    if (sVar2 == 2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,methodName);
      return __return_storage_ptr__;
    }
    __pos = sVar2 - 1;
    lVar1 = sVar2 - 2;
    sVar2 = __pos;
  } while ((methodName->_M_dataplus)._M_p[lVar1] != ':');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (__return_storage_ptr__,methodName,__pos,0xffffffffffffffff);
  return __return_storage_ptr__;
}

Assistant:

std::string Output::stripMethodName(const std::string &methodName) const {
  std::size_t pos = methodName.size() - 1;
  while (pos > 0) {
    if (methodName[pos] == ':')
      return methodName.substr(pos + 1);
    --pos;
  }
  return methodName;
}